

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

Generator * __thiscall kratos::Stmt::generator_parent(Stmt *this)

{
  IRNodeKind IVar1;
  StatementType SVar2;
  int iVar3;
  undefined4 extraout_var;
  element_type *peVar4;
  undefined4 extraout_var_00;
  Stmt *local_80;
  undefined1 local_40 [24];
  ForStmt *for_;
  IRNode *pIStack_20;
  uint32_t i;
  IRNode *p;
  Stmt *this_local;
  
  pIStack_20 = this->parent_;
  for_._4_4_ = 0;
  p = &this->super_IRNode;
  while ((for_._4_4_ < 100000 && pIStack_20 != (IRNode *)0x0 &&
         (IVar1 = IRNode::ir_node_kind(pIStack_20), IVar1 != GeneratorKind))) {
    iVar3 = (*pIStack_20->_vptr_IRNode[4])();
    pIStack_20 = (IRNode *)CONCAT44(extraout_var,iVar3);
    for_._4_4_ = for_._4_4_ + 1;
  }
  if ((pIStack_20 == (IRNode *)0x0) ||
     (IVar1 = IRNode::ir_node_kind(pIStack_20), IVar1 != GeneratorKind)) {
    SVar2 = type(this);
    if ((((SVar2 == Block) && (this->parent_ != (IRNode *)0x0)) &&
        (IVar1 = IRNode::ir_node_kind(this->parent_), IVar1 == StmtKind)) &&
       (SVar2 = type((Stmt *)this->parent_), SVar2 == For)) {
      local_40._16_8_ = this->parent_;
      ForStmt::get_iter_var((ForStmt *)local_40);
      peVar4 = std::__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
      iVar3 = (*(peVar4->super_Var).super_IRNode._vptr_IRNode[0xd])();
      this_local = (Stmt *)CONCAT44(extraout_var_00,iVar3);
      std::shared_ptr<kratos::IterVar>::~shared_ptr((shared_ptr<kratos::IterVar> *)local_40);
    }
    else {
      this_local = (Stmt *)0x0;
    }
  }
  else {
    if (pIStack_20 == (IRNode *)0x0) {
      local_80 = (Stmt *)0x0;
    }
    else {
      local_80 = (Stmt *)__dynamic_cast(pIStack_20,&IRNode::typeinfo,&Generator::typeinfo,0);
    }
    this_local = local_80;
  }
  return (Generator *)this_local;
}

Assistant:

Generator *Stmt::generator_parent() const {
    IRNode *p = parent_;
    // we don't do while loop here to prevent infinite loop
    // 100000 is sufficient for almost all designs.
    for (uint32_t i = 0; i < 100000u && p; i++) {
        if (p->ir_node_kind() != IRNodeKind::GeneratorKind) {
            p = p->parent();
        } else {
            break;
        }
    }
    if (!p || p->ir_node_kind() != IRNodeKind::GeneratorKind) {
        // special case for nested for loop
        if (type() == StatementType::Block && parent_ &&
            parent_->ir_node_kind() == IRNodeKind::StmtKind &&
            reinterpret_cast<Stmt *>(parent_)->type() == StatementType::For) {
            // take the best shot
            auto *for_ = reinterpret_cast<ForStmt *>(parent_);
            return for_->get_iter_var()->generator();
        }
        return nullptr;
    }
    return dynamic_cast<Generator *>(p);
}